

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util.cc
# Opt level: O2

bool EqualsCaseInsensitiveASCII(StringPiece a,StringPiece b)

{
  char cVar1;
  size_t sVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  
  if (a.len_ != b.len_) {
    return false;
  }
  sVar2 = 0;
  do {
    bVar5 = a.len_ == sVar2;
    if (bVar5) {
      return bVar5;
    }
    cVar1 = a.str_[sVar2];
    cVar3 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar3 = cVar1;
    }
    cVar1 = b.str_[sVar2];
    cVar4 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar4 = cVar1;
    }
    sVar2 = sVar2 + 1;
  } while (cVar3 == cVar4);
  return bVar5;
}

Assistant:

bool EqualsCaseInsensitiveASCII(StringPiece a, StringPiece b) {
  if (a.len_ != b.len_) {
    return false;
  }

  for (size_t i = 0; i < a.len_; ++i) {
    if (ToLowerASCII(a.str_[i]) != ToLowerASCII(b.str_[i])) {
      return false;
    }
  }

  return true;
}